

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_fs_poll_ref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_fs_poll_t h;
  uv_stream_t uStack_388;
  uv_loop_t *puStack_290;
  uv_stream_t uStack_280;
  uv_loop_t *puStack_188;
  uv_tcp_t uStack_178;
  uv_loop_t *puStack_80;
  uv_fs_poll_t local_70;
  
  puStack_80 = (uv_loop_t *)0x166bb9;
  puVar2 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x166bc9;
  uv_fs_poll_init(puVar2,&local_70);
  puStack_80 = (uv_loop_t *)0x166bdf;
  uv_fs_poll_start(&local_70,(uv_fs_poll_cb)0x0,".",999);
  puStack_80 = (uv_loop_t *)0x166be7;
  uv_unref((uv_handle_t *)&local_70);
  puStack_80 = (uv_loop_t *)0x166bec;
  puVar2 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x166bf6;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_80 = (uv_loop_t *)0x166bfe;
  do_close(&local_70);
  puStack_80 = (uv_loop_t *)0x166c03;
  puVar2 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x166c17;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_80 = (uv_loop_t *)0x166c21;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_80 = (uv_loop_t *)0x166c26;
  puVar3 = uv_default_loop();
  puStack_80 = (uv_loop_t *)0x166c2e;
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_80 = (uv_loop_t *)run_test_tcp_ref;
  run_test_fs_poll_ref_cold_1();
  puStack_188 = (uv_loop_t *)0x166c4c;
  puStack_80 = puVar2;
  puVar2 = uv_default_loop();
  puStack_188 = (uv_loop_t *)0x166c5c;
  uv_tcp_init(puVar2,&uStack_178);
  puStack_188 = (uv_loop_t *)0x166c64;
  uv_unref((uv_handle_t *)&uStack_178);
  puStack_188 = (uv_loop_t *)0x166c69;
  puVar2 = uv_default_loop();
  puStack_188 = (uv_loop_t *)0x166c73;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_188 = (uv_loop_t *)0x166c7b;
  do_close(&uStack_178);
  puStack_188 = (uv_loop_t *)0x166c80;
  puVar2 = uv_default_loop();
  puStack_188 = (uv_loop_t *)0x166c94;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_188 = (uv_loop_t *)0x166c9e;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_188 = (uv_loop_t *)0x166ca3;
  puVar3 = uv_default_loop();
  puStack_188 = (uv_loop_t *)0x166cab;
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_188 = (uv_loop_t *)run_test_tcp_ref2;
  run_test_tcp_ref_cold_1();
  puStack_290 = (uv_loop_t *)0x166ccc;
  puStack_188 = puVar2;
  puVar2 = uv_default_loop();
  puStack_290 = (uv_loop_t *)0x166cdc;
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_280);
  puStack_290 = (uv_loop_t *)0x166cf0;
  uv_listen(&uStack_280,0x80,fail_cb);
  puStack_290 = (uv_loop_t *)0x166cf8;
  uv_unref((uv_handle_t *)&uStack_280);
  puStack_290 = (uv_loop_t *)0x166cfd;
  puVar2 = uv_default_loop();
  puStack_290 = (uv_loop_t *)0x166d07;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_290 = (uv_loop_t *)0x166d0f;
  do_close(&uStack_280);
  puStack_290 = (uv_loop_t *)0x166d14;
  puVar2 = uv_default_loop();
  puStack_290 = (uv_loop_t *)0x166d28;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_290 = (uv_loop_t *)0x166d32;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_290 = (uv_loop_t *)0x166d37;
  puVar3 = uv_default_loop();
  puStack_290 = (uv_loop_t *)0x166d3f;
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_290 = (uv_loop_t *)run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  puStack_290 = puVar2;
  puVar2 = uv_default_loop();
  uv_tcp_init(puVar2,(uv_tcp_t *)&uStack_388);
  uv_listen(&uStack_388,0x80,fail_cb);
  uv_unref((uv_handle_t *)&uStack_388);
  uv_close((uv_handle_t *)&uStack_388,close_cb);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  if (close_cb_called == 1) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_ref) {
  uv_fs_poll_t h;
  uv_fs_poll_init(uv_default_loop(), &h);
  uv_fs_poll_start(&h, NULL, ".", 999);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}